

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsa_GetStreamOutputCard(PaStream *s,int *card)

{
  snd_pcm_t *psVar1;
  long lVar2;
  size_t sVar3;
  int iVar4;
  size_t __n;
  undefined8 uStack_40;
  size_t local_38;
  size_t __alsa_alloca_size;
  snd_pcm_info_t *pcmInfo;
  PaAlsaStream *pPStack_20;
  PaError result;
  PaAlsaStream *stream;
  int *card_local;
  PaStream *s_local;
  
  pcmInfo._4_4_ = 0;
  uStack_40 = 0x10bcd4;
  stream = (PaAlsaStream *)card;
  card_local = (int *)s;
  paUtilErr_ = GetAlsaStreamPointer(s,&stack0xffffffffffffffe0);
  if (paUtilErr_ < 0) {
    uStack_40 = 0x10bcfb;
    PaUtil_DebugPrint(
                     "Expression \'GetAlsaStreamPointer( s, &stream )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4605\n"
                     );
    pcmInfo._4_4_ = paUtilErr_;
  }
  else if ((pPStack_20->playback).pcm == (snd_pcm_t *)0x0) {
    uStack_40 = 0x10bd37;
    PaUtil_DebugPrint(
                     "Expression \'stream->playback.pcm\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4608\n"
                     );
    pcmInfo._4_4_ = -0x2701;
  }
  else {
    uStack_40 = 0x10bd50;
    __n = (*(code *)alsa_snd_pcm_info_sizeof)();
    lVar2 = -(__n + 0xf & 0xfffffffffffffff0);
    local_38 = __n;
    __alsa_alloca_size = (size_t)((long)&local_38 + lVar2);
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x10bd7c;
    memset((void *)((long)&local_38 + lVar2),0,__n);
    sVar3 = __alsa_alloca_size;
    psVar1 = (pPStack_20->playback).pcm;
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x10bd96;
    paUtilErr_ = (*alsa_snd_pcm_info)(psVar1,(snd_pcm_info_t *)sVar3);
    sVar3 = __alsa_alloca_size;
    if (paUtilErr_ < 0) {
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x10bdbd;
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_info( stream->playback.pcm, pcmInfo )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4611\n"
                       );
      pcmInfo._4_4_ = paUtilErr_;
    }
    else {
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x10bdd7;
      iVar4 = (*alsa_snd_pcm_info_get_card)((snd_pcm_info_t *)sVar3);
      *(int *)&(stream->streamRepresentation).magic = iVar4;
    }
  }
  return pcmInfo._4_4_;
}

Assistant:

PaError PaAlsa_GetStreamOutputCard( PaStream* s, int* card )
{
    PaAlsaStream *stream;
    PaError result = paNoError;
    snd_pcm_info_t* pcmInfo;

    PA_ENSURE( GetAlsaStreamPointer( s, &stream ) );

    /* XXX: More descriptive error? */
    PA_UNLESS( stream->playback.pcm, paDeviceUnavailable );

    alsa_snd_pcm_info_alloca( &pcmInfo );
    PA_ENSURE( alsa_snd_pcm_info( stream->playback.pcm, pcmInfo ) );
    *card = alsa_snd_pcm_info_get_card( pcmInfo );

error:
    return result;
}